

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::CTestFileExists(cmCTest *this,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testingDir;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  pcVar1 = (this->BinaryDir)._M_dataplus._M_p;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar1,pcVar1 + (this->BinaryDir)._M_string_length);
  std::__cxx11::string::append((char *)local_a8);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_a8,(ulong)(this->CurrentTag)._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
    local_48 = (long *)*plVar3;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_48,(ulong)(filename->_M_dataplus)._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  bVar2 = cmsys::SystemTools::FileExists((char *)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  return bVar2;
}

Assistant:

bool cmCTest::CTestFileExists(const std::string& filename)
{
  std::string testingDir =
    this->BinaryDir + "/Testing/" + this->CurrentTag + "/" + filename;
  return cmSystemTools::FileExists(testingDir.c_str());
}